

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_data.cpp
# Opt level: O0

FTextureID gl_GetSpriteFrame(uint sprite,int frame,int rot,angle_t ang,bool *mirror)

{
  bool bVar1;
  spriteframe_t *psVar2;
  spriteframe_t *sprframe;
  spritedef_t *local_30;
  spritedef_t *sprdef;
  bool *mirror_local;
  uint local_18;
  angle_t ang_local;
  int rot_local;
  int frame_local;
  uint sprite_local;
  
  sprdef = (spritedef_t *)mirror;
  mirror_local._4_4_ = ang;
  local_18 = rot;
  ang_local = frame;
  rot_local = sprite;
  local_30 = TArray<spritedef_t,_spritedef_t>::operator[](&sprites,(ulong)sprite);
  if ((int)ang_local < (int)(uint)local_30->numframes) {
    psVar2 = TArray<spriteframe_t,_spriteframe_t>::operator[]
                       (&SpriteFrames,(long)(int)(local_30->spriteframes + ang_local));
    if (local_18 == 0xffffffff) {
      bVar1 = FTextureID::operator==(psVar2->Texture,psVar2->Texture + 1);
      if (bVar1) {
        local_18 = mirror_local._4_4_ + 0x90000000;
      }
      else {
        local_18 = mirror_local._4_4_ + 0x88000000;
      }
      local_18 = local_18 >> 0x1c;
    }
    if (sprdef != (spritedef_t *)0x0) {
      (sprdef->field_0).name[0] = ((uint)psVar2->Flip & 1 << ((byte)local_18 & 0x1f)) != 0;
    }
    frame_local = psVar2->Texture[(int)local_18].texnum;
  }
  else {
    FNullTextureID::FNullTextureID((FNullTextureID *)((long)&sprframe + 4));
    frame_local = sprframe._4_4_;
  }
  return (FTextureID)frame_local;
}

Assistant:

FTextureID gl_GetSpriteFrame(unsigned sprite, int frame, int rot, angle_t ang, bool *mirror)
{
	spritedef_t *sprdef = &sprites[sprite];
	if (frame >= sprdef->numframes)
	{
		// If there are no frames at all for this sprite, don't draw it.
		return FNullTextureID();
	}
	else
	{
		//picnum = SpriteFrames[sprdef->spriteframes + thing->frame].Texture[0];
		// choose a different rotation based on player view
		spriteframe_t *sprframe = &SpriteFrames[sprdef->spriteframes + frame];
		if (rot==-1)
		{
			if (sprframe->Texture[0] == sprframe->Texture[1])
			{
				rot = (ang + (angle_t)(ANGLE_90/4)*9) >> 28;
			}
			else
			{
				rot = (ang + (angle_t)(ANGLE_90/4)*9-(angle_t)(ANGLE_180/16)) >> 28;
			}
		}
		if (mirror) *mirror = !!(sprframe->Flip&(1<<rot));
		return sprframe->Texture[rot];
	}
}